

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdispnames.cpp
# Opt level: O0

int32_t uloc_getDisplayKeyword_63
                  (char *keyword,char *displayLocale,UChar *dest,int32_t destCapacity,
                  UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  UErrorCode *status_local;
  int32_t destCapacity_local;
  UChar *dest_local;
  char *displayLocale_local;
  char *keyword_local;
  
  if ((status == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    return 0;
  }
  if ((-1 < destCapacity) && ((destCapacity < 1 || (dest != (UChar *)0x0)))) {
    iVar2 = _getStringOrCopyKey("icudt63l-lang",displayLocale,"Keys",(char *)0x0,keyword,keyword,
                                dest,destCapacity,status);
    return iVar2;
  }
  *status = U_ILLEGAL_ARGUMENT_ERROR;
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uloc_getDisplayKeyword(const char* keyword,
                       const char* displayLocale,
                       UChar* dest,
                       int32_t destCapacity,
                       UErrorCode* status){

    /* argument checking */
    if(status==NULL || U_FAILURE(*status)) {
        return 0;
    }

    if(destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        *status=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }


    /* pass itemKey=NULL to look for a top-level item */
    return _getStringOrCopyKey(U_ICUDATA_LANG, displayLocale,
                               _kKeys, NULL, 
                               keyword, 
                               keyword,      
                               dest, destCapacity,
                               status);

}